

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spectest-interp.cc
# Opt level: O0

Result __thiscall
spectest::CommandRunner::ReadInvalidTextModule
          (CommandRunner *this,string_view module_filename,string *header)

{
  bool bVar1;
  uchar *size;
  pointer lexer_00;
  pointer line_finder_00;
  __uniq_ptr_data<wabt::WastLexer,_std::default_delete<wabt::WastLexer>,_true,_true> this_00;
  string_view filename;
  string_view filename_00;
  undefined1 local_b8 [8];
  unique_ptr<wabt::LexerSourceLineFinder,_std::default_delete<wabt::LexerSourceLineFinder>_>
  line_finder;
  undefined1 local_a6 [8];
  WastParseOptions options;
  unique_ptr<wabt::Module,_std::default_delete<wabt::Module>_> module;
  undefined1 local_88 [8];
  Errors errors;
  unique_ptr<wabt::WastLexer,_std::default_delete<wabt::WastLexer>_> local_60;
  unique_ptr<wabt::WastLexer,_std::default_delete<wabt::WastLexer>_> lexer;
  undefined1 local_48 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> file_data;
  string *header_local;
  CommandRunner *this_local;
  string_view module_filename_local;
  Result result;
  
  this_00.super___uniq_ptr_impl<wabt::WastLexer,_std::default_delete<wabt::WastLexer>_>._M_t.
  super__Tuple_impl<0UL,_wabt::WastLexer_*,_std::default_delete<wabt::WastLexer>_>.
  super__Head_base<0UL,_wabt::WastLexer_*,_false>._M_head_impl =
       (__uniq_ptr_impl<wabt::WastLexer,_std::default_delete<wabt::WastLexer>_>)
       module_filename.data_;
  file_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)header;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_48);
  filename.size_ = (size_type)local_48;
  filename.data_ = (char *)module_filename.size_;
  lexer._M_t.super___uniq_ptr_impl<wabt::WastLexer,_std::default_delete<wabt::WastLexer>_>._M_t.
  super__Tuple_impl<0UL,_wabt::WastLexer_*,_std::default_delete<wabt::WastLexer>_>.
  super__Head_base<0UL,_wabt::WastLexer_*,_false>._M_head_impl =
       (__uniq_ptr_data<wabt::WastLexer,_std::default_delete<wabt::WastLexer>,_true,_true>)
       (__uniq_ptr_data<wabt::WastLexer,_std::default_delete<wabt::WastLexer>,_true,_true>)
       this_00.super___uniq_ptr_impl<wabt::WastLexer,_std::default_delete<wabt::WastLexer>_>._M_t.
       super__Tuple_impl<0UL,_wabt::WastLexer_*,_std::default_delete<wabt::WastLexer>_>.
       super__Head_base<0UL,_wabt::WastLexer_*,_false>._M_head_impl;
  module_filename_local.size_._4_4_ =
       wabt::ReadFile((wabt *)this_00.
                              super___uniq_ptr_impl<wabt::WastLexer,_std::default_delete<wabt::WastLexer>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_wabt::WastLexer_*,_std::default_delete<wabt::WastLexer>_>
                              .super__Head_base<0UL,_wabt::WastLexer_*,_false>._M_head_impl,filename
                      ,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)header);
  errors.super__Vector_base<wabt::Error,_std::allocator<wabt::Error>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (pointer)this_00.
                super___uniq_ptr_impl<wabt::WastLexer,_std::default_delete<wabt::WastLexer>_>._M_t.
                super__Tuple_impl<0UL,_wabt::WastLexer_*,_std::default_delete<wabt::WastLexer>_>.
                super__Head_base<0UL,_wabt::WastLexer_*,_false>._M_head_impl;
  size = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                   ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_48);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_48);
  filename_00.size_ =
       (size_type)
       errors.super__Vector_base<wabt::Error,_std::allocator<wabt::Error>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  filename_00.data_ = (char *)&local_60;
  wabt::WastLexer::CreateBufferLexer(filename_00,(char *)module_filename.size_,(size_t)size);
  std::vector<wabt::Error,_std::allocator<wabt::Error>_>::vector
            ((vector<wabt::Error,_std::allocator<wabt::Error>_> *)local_88);
  bVar1 = wabt::Succeeded(module_filename_local.size_._4_4_);
  if (bVar1) {
    std::unique_ptr<wabt::Module,std::default_delete<wabt::Module>>::
    unique_ptr<std::default_delete<wabt::Module>,void>
              ((unique_ptr<wabt::Module,std::default_delete<wabt::Module>> *)
               &options.features.multi_value_enabled_);
    wabt::WastParseOptions::WastParseOptions((WastParseOptions *)local_a6,&s_features);
    lexer_00 = std::unique_ptr<wabt::WastLexer,_std::default_delete<wabt::WastLexer>_>::get
                         (&local_60);
    module_filename_local.size_._4_4_ =
         wabt::ParseWatModule
                   (lexer_00,(unique_ptr<wabt::Module,_std::default_delete<wabt::Module>_> *)
                             &options.features.multi_value_enabled_,(Errors *)local_88,
                    (WastParseOptions *)local_a6);
    line_finder._M_t.
    super___uniq_ptr_impl<wabt::LexerSourceLineFinder,_std::default_delete<wabt::LexerSourceLineFinder>_>
    ._M_t.
    super__Tuple_impl<0UL,_wabt::LexerSourceLineFinder_*,_std::default_delete<wabt::LexerSourceLineFinder>_>
    .super__Head_base<0UL,_wabt::LexerSourceLineFinder_*,_false>._M_head_impl._4_4_ =
         module_filename_local.size_._4_4_;
    std::unique_ptr<wabt::Module,_std::default_delete<wabt::Module>_>::~unique_ptr
              ((unique_ptr<wabt::Module,_std::default_delete<wabt::Module>_> *)
               &options.features.multi_value_enabled_);
  }
  std::unique_ptr<wabt::WastLexer,_std::default_delete<wabt::WastLexer>_>::operator->(&local_60);
  wabt::WastLexer::MakeLineFinder((WastLexer *)local_b8);
  line_finder_00 =
       std::
       unique_ptr<wabt::LexerSourceLineFinder,_std::default_delete<wabt::LexerSourceLineFinder>_>::
       get((unique_ptr<wabt::LexerSourceLineFinder,_std::default_delete<wabt::LexerSourceLineFinder>_>
            *)local_b8);
  wabt::FormatErrorsToFile
            ((Errors *)local_88,Text,line_finder_00,_stdout,
             (string *)
             file_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage,Once,0x50);
  std::unique_ptr<wabt::LexerSourceLineFinder,_std::default_delete<wabt::LexerSourceLineFinder>_>::
  ~unique_ptr((unique_ptr<wabt::LexerSourceLineFinder,_std::default_delete<wabt::LexerSourceLineFinder>_>
               *)local_b8);
  std::vector<wabt::Error,_std::allocator<wabt::Error>_>::~vector
            ((vector<wabt::Error,_std::allocator<wabt::Error>_> *)local_88);
  std::unique_ptr<wabt::WastLexer,_std::default_delete<wabt::WastLexer>_>::~unique_ptr(&local_60);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_48);
  return (Result)module_filename_local.size_._4_4_;
}

Assistant:

wabt::Result CommandRunner::ReadInvalidTextModule(string_view module_filename,
                                            const std::string& header) {
  std::vector<uint8_t> file_data;
  wabt::Result result = ReadFile(module_filename, &file_data);
  std::unique_ptr<WastLexer> lexer = WastLexer::CreateBufferLexer(
      module_filename, file_data.data(), file_data.size());
  Errors errors;
  if (Succeeded(result)) {
    std::unique_ptr<wabt::Module> module;
    WastParseOptions options(s_features);
    result = ParseWatModule(lexer.get(), &module, &errors, &options);
  }

  auto line_finder = lexer->MakeLineFinder();
  FormatErrorsToFile(errors, Location::Type::Text, line_finder.get(), stdout,
                     header, PrintHeader::Once);
  return result;
}